

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::ForwardPass(GlobOpt *this)

{
  Type *this_00;
  JitArenaAllocator *pJVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  RegSlot RVar6;
  JITTimeFunctionBody *this_01;
  SparseArray<Value> *pSVar7;
  BVSparse<Memory::JitArenaAllocator> *pBVar8;
  undefined4 *puVar9;
  uint32 chunkSize;
  uint uVar10;
  uint uVar11;
  BasicBlock *block;
  BasicBlock *pBVar12;
  undefined1 local_258 [8];
  IntConstantToStackSymMap localIntConstantToStackSymMap;
  IntConstantToValueMap localIntConstantToValueMap;
  Int64ConstantToValueMap localInt64ConstantToValueMap;
  AddrConstantToValueMap localAddrConstantToValueMap;
  StringConstantToValueMap localStringConstantToValueMap;
  SymIdToInstrMap localPrePassInstrMap;
  ValueSetByValueNumber localValuesCreatedForClone;
  ValueNumberPairToValueMap localValuesCreatedForMerge;
  OpndList localNoImplicitCallUsesToInsert;
  BVSparse<Memory::JitArenaAllocator> localFinishedStackLiteralInitFld;
  undefined1 local_40 [8];
  AutoCodeGenPhase __autoCodeGen;
  
  local_40 = (undefined1  [8])this->func;
  __autoCodeGen.func._0_4_ = 0x68;
  Func::BeginPhase((Func *)local_40,ForwardPhase);
  uVar4 = Func::GetSourceContextId(this->func);
  uVar5 = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar4,uVar5);
  if (bVar3) {
    Func::DumpHeader(this->func);
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,GlobOptPhase);
  if (bVar3) {
    TraceSettings(this);
  }
  pJVar1 = this->alloc;
  this_01 = Func::GetJITFunctionBody(this->func);
  RVar6 = JITTimeFunctionBody::GetConstCount(this_01);
  chunkSize = 0x40;
  if (0x40 < RVar6) {
    chunkSize = RVar6;
  }
  pSVar7 = SparseArray<Value>::New(&pJVar1->super_ArenaAllocator,chunkSize);
  this->byteCodeConstantValueArray = pSVar7;
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3d6ef4);
  pJVar1 = this->alloc;
  pBVar8->head = (Type_conflict)0x0;
  pBVar8->lastFoundIndex = (Type_conflict)0x0;
  pBVar8->alloc = pJVar1;
  pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
  this->byteCodeConstantValueNumbersBv = pBVar8;
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3d6ef4);
  pJVar1 = this->alloc;
  pBVar8->head = (Type_conflict)0x0;
  pBVar8->lastFoundIndex = (Type_conflict)0x0;
  pBVar8->alloc = pJVar1;
  pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
  this->tempBv = pBVar8;
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3d6ef4);
  pJVar1 = this->alloc;
  pBVar8->head = (Type_conflict)0x0;
  pBVar8->lastFoundIndex = (Type_conflict)0x0;
  pBVar8->alloc = pJVar1;
  pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
  this->prePassCopyPropSym = pBVar8;
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3d6ef4);
  pJVar1 = this->alloc;
  pBVar8->head = (Type_conflict)0x0;
  pBVar8->lastFoundIndex = (Type_conflict)0x0;
  pBVar8->alloc = pJVar1;
  pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
  this->slotSyms = pBVar8;
  this->byteCodeUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->propertySymUse = (PropertySym *)0x0;
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3d6ef4);
  pJVar1 = this->alloc;
  pBVar8->head = (Type_conflict)0x0;
  pBVar8->lastFoundIndex = (Type_conflict)0x0;
  pBVar8->alloc = pJVar1;
  pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
  this->changedSymsAfterIncBailoutCandidate = pBVar8;
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3d6ef4);
  pJVar1 = this->alloc;
  pBVar8->head = (Type_conflict)0x0;
  pBVar8->lastFoundIndex = (Type_conflict)0x0;
  pBVar8->alloc = pJVar1;
  pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
  this->auxSlotPtrSyms = pBVar8;
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3d6ef4);
  pJVar1 = this->alloc;
  pBVar8->head = (Type_conflict)0x0;
  pBVar8->lastFoundIndex = (Type_conflict)0x0;
  pBVar8->alloc = pJVar1;
  pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
  this->byteCodeUsesBeforeOpt = pBVar8;
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,FieldCopyPropPhase);
  if (bVar3) {
    bVar3 = DoFunctionFieldCopyProp(this);
    if (bVar3) {
      Output::Print(L"TRACE: CanDoFieldCopyProp Func: ");
      Func::DumpFullFunctionName(this->func);
      Output::Print(L"\n");
    }
  }
  localNoImplicitCallUsesToInsert.
  super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>._16_8_ = this->alloc;
  localValuesCreatedForMerge.stats = (Type)&PTR_IsReadOnly_01371f60;
  localNoImplicitCallUsesToInsert.
  super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>._vptr_ReadOnlyList =
       (_func_int **)0x0;
  localNoImplicitCallUsesToInsert.
  super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>.buffer._0_4_ = 0;
  localNoImplicitCallUsesToInsert.
  super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  this->noImplicitCallUsesToInsert = (OpndList *)&localValuesCreatedForMerge.stats;
  JsUtil::
  BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)local_258,
                   (AllocatorType *)
                   localNoImplicitCallUsesToInsert.
                   super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>._16_8_
                   ,0);
  this->intConstantToStackSymMap =
       (BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)local_258;
  JsUtil::
  BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localIntConstantToStackSymMap.stats,this->alloc,0);
  this->intConstantToValueMap = (IntConstantToValueMap *)&localIntConstantToStackSymMap.stats;
  JsUtil::
  BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localIntConstantToValueMap.stats,this->alloc,0);
  this->int64ConstantToValueMap = (Int64ConstantToValueMap *)&localIntConstantToValueMap.stats;
  JsUtil::
  BaseDictionary<void_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<void_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localInt64ConstantToValueMap.stats,this->alloc,0);
  this->addrConstantToValueMap = (AddrConstantToValueMap *)&localInt64ConstantToValueMap.stats;
  JsUtil::
  BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localAddrConstantToValueMap.stats,this->alloc,0);
  this->stringConstantToValueMap = (StringConstantToValueMap *)&localAddrConstantToValueMap.stats;
  JsUtil::
  BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localStringConstantToValueMap.stats,this->alloc,0);
  this->prePassInstrMap = (SymIdToInstrMap *)&localStringConstantToValueMap.stats;
  JsUtil::
  BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    *)&localPrePassInstrMap.stats,this->alloc,0x40);
  this->valuesCreatedForClone = (ValueSetByValueNumber *)&localPrePassInstrMap.stats;
  this_00 = &localValuesCreatedForClone.
             super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             .stats;
  JsUtil::
  BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)this_00,this->alloc,0x40);
  this->valuesCreatedForMerge = (ValueNumberPairToValueMap *)this_00;
  localNoImplicitCallUsesToInsert._40_8_ = 0;
  this->finishedStackLiteralInitFld =
       (BVSparse<Memory::JitArenaAllocator> *)&localNoImplicitCallUsesToInsert.field_0x28;
  pBVar12 = this->func->m_fg->blockList;
  while (block = pBVar12, block != (BasicBlock *)0x0) {
    pBVar12 = block->next;
    if ((block->field_0x18 & 1) == 0) {
      OptBlock(this,block);
    }
  }
  uVar4 = Func::GetSourceContextId(this->func);
  uVar5 = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,MemOpPhase,uVar4,uVar5);
  if (!bVar3) {
    ProcessMemOp(this);
  }
  this->noImplicitCallUsesToInsert = (OpndList *)0x0;
  this->stringConstantToValueMap = (StringConstantToValueMap *)0x0;
  this->finishedStackLiteralInitFld = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->int64ConstantToValueMap = (Int64ConstantToValueMap *)0x0;
  this->addrConstantToValueMap = (AddrConstantToValueMap *)0x0;
  this->intConstantToStackSymMap = (IntConstantToStackSymMap *)0x0;
  this->intConstantToValueMap = (IntConstantToValueMap *)0x0;
  pBVar12 = (BasicBlock *)&this->func->m_fg->blockList;
  uVar10 = 0;
  uVar11 = 0;
  while (pBVar12 = pBVar12->next, pBVar12 != (BasicBlock *)0x0) {
    if ((pBVar12->field_0x18 & 1) == 0) {
      bVar3 = pBVar12->dataUseCount == 0;
      pBVar12->dataUseCount = 0;
      uVar10 = uVar10 + bVar3;
      uVar11 = uVar11 + !bVar3;
      if (pBVar12->cloneStrCandidates != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        Memory::
        DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                  (this->alloc,pBVar12->cloneStrCandidates);
        pBVar12->cloneStrCandidates = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      }
    }
  }
  if (uVar10 < uVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1bb,"(freedCount >= spilledCount)","freedCount >= spilledCount");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
  }
  this->changedSymsAfterIncBailoutCandidate = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->auxSlotPtrSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_40,this->func,ForwardPhase,true,true);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)&localNoImplicitCallUsesToInsert.field_0x28);
  JsUtil::
  BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localValuesCreatedForClone.
                        super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                        .stats);
  JsUtil::
  BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     *)&localPrePassInstrMap.stats);
  JsUtil::
  BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localStringConstantToValueMap.stats);
  JsUtil::
  BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localAddrConstantToValueMap.stats);
  JsUtil::
  BaseDictionary<void_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<void_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localInt64ConstantToValueMap.stats);
  JsUtil::
  BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localIntConstantToValueMap.stats);
  JsUtil::
  BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localIntConstantToStackSymMap.stats);
  JsUtil::
  BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)local_258);
  JsUtil::List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::~List((List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)&localValuesCreatedForMerge.stats);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_40);
  return;
}

Assistant:

void
GlobOpt::ForwardPass()
{
    BEGIN_CODEGEN_PHASE(this->func, Js::ForwardPhase);

#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::GlobOptPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
    {
        this->func->DumpHeader();
    }
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::GlobOptPhase))
    {
        this->TraceSettings();
    }
#endif

    // GetConstantCount() gives us the right size to pick for the SparseArray, but we may need more if we've inlined
    // functions with constants. There will be a gap in the symbol numbering between the main constants and
    // the inlined ones, so we'll most likely need a new array chunk. Make the min size of the array chunks be 64
    // in case we have a main function with very few constants and a bunch of constants from inlined functions.
    this->byteCodeConstantValueArray = SparseArray<Value>::New(this->alloc, max(this->func->GetJITFunctionBody()->GetConstCount(), 64U));
    this->byteCodeConstantValueNumbersBv = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    this->tempBv = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    this->prePassCopyPropSym = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    this->slotSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    this->byteCodeUses = nullptr;
    this->propertySymUse = nullptr;

    // changedSymsAfterIncBailoutCandidate helps track building incremental bailout in ForwardPass
    this->changedSymsAfterIncBailoutCandidate = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);

    this->auxSlotPtrSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);

#if DBG
    this->byteCodeUsesBeforeOpt = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::FieldCopyPropPhase) && this->DoFunctionFieldCopyProp())
    {
        Output::Print(_u("TRACE: CanDoFieldCopyProp Func: "));
        this->func->DumpFullFunctionName();
        Output::Print(_u("\n"));
    }
#endif

    OpndList localNoImplicitCallUsesToInsert(alloc);
    this->noImplicitCallUsesToInsert = &localNoImplicitCallUsesToInsert;
    IntConstantToStackSymMap localIntConstantToStackSymMap(alloc);
    this->intConstantToStackSymMap = &localIntConstantToStackSymMap;
    IntConstantToValueMap localIntConstantToValueMap(alloc);
    this->intConstantToValueMap = &localIntConstantToValueMap;
    Int64ConstantToValueMap localInt64ConstantToValueMap(alloc);
    this->int64ConstantToValueMap = &localInt64ConstantToValueMap;
    AddrConstantToValueMap localAddrConstantToValueMap(alloc);
    this->addrConstantToValueMap = &localAddrConstantToValueMap;
    StringConstantToValueMap localStringConstantToValueMap(alloc);
    this->stringConstantToValueMap = &localStringConstantToValueMap;
    SymIdToInstrMap localPrePassInstrMap(alloc);
    this->prePassInstrMap = &localPrePassInstrMap;
    ValueSetByValueNumber localValuesCreatedForClone(alloc, 64);
    this->valuesCreatedForClone = &localValuesCreatedForClone;
    ValueNumberPairToValueMap localValuesCreatedForMerge(alloc, 64);
    this->valuesCreatedForMerge = &localValuesCreatedForMerge;

#if DBG
    BVSparse<JitArenaAllocator> localFinishedStackLiteralInitFld(alloc);
    this->finishedStackLiteralInitFld = &localFinishedStackLiteralInitFld;
#endif

    FOREACH_BLOCK_IN_FUNC_EDITING(block, this->func)
    {
        this->OptBlock(block);
    } NEXT_BLOCK_IN_FUNC_EDITING;

    if (!PHASE_OFF(Js::MemOpPhase, this->func))
    {
        ProcessMemOp();
    }

    this->noImplicitCallUsesToInsert = nullptr;
    this->intConstantToStackSymMap = nullptr;
    this->intConstantToValueMap = nullptr;
    this->int64ConstantToValueMap = nullptr;
    this->addrConstantToValueMap = nullptr;
    this->stringConstantToValueMap = nullptr;
#if DBG
    this->finishedStackLiteralInitFld = nullptr;
    uint freedCount = 0;
    uint spilledCount = 0;
#endif

    FOREACH_BLOCK_IN_FUNC(block, this->func)
    {
#if DBG
        if (block->GetDataUseCount() == 0)
        {
            freedCount++;
        }
        else
        {
            spilledCount++;
        }
#endif
        block->SetDataUseCount(0);
        if (block->cloneStrCandidates)
        {
            JitAdelete(this->alloc, block->cloneStrCandidates);
            block->cloneStrCandidates = nullptr;
        }
    } NEXT_BLOCK_IN_FUNC;

    // Make sure we free most of them.
    Assert(freedCount >= spilledCount);

    // this->alloc will be freed right after return, no need to free it here
    this->changedSymsAfterIncBailoutCandidate = nullptr;
    this->auxSlotPtrSyms = nullptr;

    END_CODEGEN_PHASE(this->func, Js::ForwardPhase);
}